

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_RocketInFlight(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  PClassActor *pufftype;
  AActor *pAVar3;
  char *__assertion;
  FName local_50;
  FSoundID local_4c;
  DAngle local_48;
  DAngle local_40;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054f6f7;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar3 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar3 == (AActor *)0x0) {
LAB_0054f56c:
        pAVar3 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054f6f7;
        }
      }
      if (numparam == 1) goto LAB_0054f5ec;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054f6e7;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054f6f7;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054f6e7;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054f5ec:
        local_4c.ID = S_FindSound("misc/missileinflight");
        S_Sound(pAVar3,2,&local_4c,1.0,1.0);
        pufftype = PClass::FindActor("MiniMissilePuff");
        local_38.X = (pAVar3->__Pos).X;
        local_38.Y = (pAVar3->__Pos).Y;
        local_38.Z = (pAVar3->__Pos).Z;
        local_48.Degrees = (pAVar3->Angles).Yaw.Degrees + -180.0;
        local_40.Degrees = local_48.Degrees;
        P_SpawnPuff(pAVar3,pufftype,&local_38,&local_40,&local_48,2,1,(AActor *)0x0);
        FName::FName(&local_50,"RocketTrail");
        AActor::Vec3Offset(&local_38,pAVar3,-(pAVar3->Vel).X,-(pAVar3->Vel).Y,0.0,false);
        pAVar3 = Spawn(&local_50,&local_38,ALLOW_REPLACE);
        if (pAVar3 != (AActor *)0x0) {
          (pAVar3->Vel).Z = 1.0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054f6f7;
    }
    if (pAVar3 == (AActor *)0x0) goto LAB_0054f56c;
  }
LAB_0054f6e7:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054f6f7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x179,"int AF_A_RocketInFlight(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RocketInFlight)
{
	PARAM_ACTION_PROLOGUE;

	AActor *trail;

	S_Sound (self, CHAN_VOICE, "misc/missileinflight", 1, ATTN_NORM);
	P_SpawnPuff (self, PClass::FindActor("MiniMissilePuff"), self->Pos(), self->Angles.Yaw - 180, self->Angles.Yaw - 180, 2, PF_HITTHING);
	trail = Spawn("RocketTrail", self->Vec3Offset(-self->Vel.X, -self->Vel.Y, 0.), ALLOW_REPLACE);
	if (trail != NULL)
	{
		trail->Vel.Z = 1;
	}
	return 0;
}